

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

xmlMutexPtr xmlNewMutex(void)

{
  xmlMutexPtr tok;
  
  tok = (xmlMutexPtr)malloc(0x28);
  if (tok == (xmlMutexPtr)0x0) {
    tok = (xmlMutexPtr)0x0;
  }
  else {
    xmlInitMutex(tok);
  }
  return tok;
}

Assistant:

xmlMutexPtr
xmlNewMutex(void)
{
    xmlMutexPtr tok;

    tok = malloc(sizeof(xmlMutex));
    if (tok == NULL)
        return (NULL);
    xmlInitMutex(tok);
    return (tok);
}